

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O0

hwaddr riscv_cpu_get_phys_page_debug_riscv64(CPUState *cs,vaddr addr)

{
  hwaddr env_00;
  RISCVCPU_conflict *addr_00;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int local_3c;
  int mmu_idx;
  int prot;
  hwaddr phys_addr;
  CPURISCVState_conflict1 *env;
  RISCVCPU_conflict *cpu;
  vaddr addr_local;
  CPUState *cs_local;
  
  phys_addr = (hwaddr)(cs[1].tb_jmp_cache + 0x143);
  env = (CPURISCVState_conflict1 *)cs;
  cpu = (RISCVCPU_conflict *)addr;
  addr_local = (vaddr)cs;
  iVar2 = riscv_cpu_mmu_index_riscv64((CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143),false)
  ;
  addr_00 = cpu;
  env_00 = phys_addr;
  _Var1 = riscv_cpu_virt_enabled_riscv64((CPURISCVState_conflict1 *)phys_addr);
  iVar3 = get_physical_address
                    ((CPURISCVState_conflict1 *)env_00,(hwaddr *)&mmu_idx,&local_3c,
                     (target_ulong)addr_00,0,iVar2,true,_Var1);
  if (iVar3 == 0) {
    _Var1 = riscv_cpu_virt_enabled_riscv64((CPURISCVState_conflict1 *)phys_addr);
    if ((_Var1) &&
       (iVar2 = get_physical_address
                          ((CPURISCVState_conflict1 *)phys_addr,(hwaddr *)&mmu_idx,&local_3c,
                           (target_ulong)_mmu_idx,0,iVar2,false,true), iVar2 != 0)) {
      cs_local = (CPUState *)0xffffffffffffffff;
    }
    else {
      cs_local = _mmu_idx;
    }
  }
  else {
    cs_local = (CPUState *)0xffffffffffffffff;
  }
  return (hwaddr)cs_local;
}

Assistant:

hwaddr riscv_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;
    int mmu_idx = cpu_mmu_index(&cpu->env, false);

    if (get_physical_address(env, &phys_addr, &prot, addr, 0, mmu_idx,
                             true, riscv_cpu_virt_enabled(env))) {
        return -1;
    }

    if (riscv_cpu_virt_enabled(env)) {
        if (get_physical_address(env, &phys_addr, &prot, phys_addr,
                                 0, mmu_idx, false, true)) {
            return -1;
        }
    }

    return phys_addr;
}